

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.cpp
# Opt level: O0

bool __thiscall
Diligent::PipelineResourceSignatureGLImpl::DvpValidateCommittedResource
          (PipelineResourceSignatureGLImpl *this,GLResourceAttribs *GLAttribs,
          RESOURCE_DIMENSION ResourceDim,bool IsMultisample,Uint32 ResIndex,
          ShaderResourceCacheGL *ResourceCache,char *ShaderName,char *PSOName)

{
  BufferGLImpl *pBVar1;
  char *pcVar2;
  undefined *puVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  BINDING_RANGE BVar7;
  Uint32 UVar8;
  Char *pCVar9;
  ResourceAttribs *Res;
  undefined8 uVar10;
  CachedResourceView *this_00;
  BufferGLImpl *pBVar11;
  ITextureView *pIVar12;
  IBufferView *pIVar13;
  PipelineResourceDesc *Desc;
  char (*in_stack_fffffffffffffcd8) [2];
  bool local_2e1;
  bool local_291;
  undefined1 local_248 [8];
  string msg_5;
  CachedResourceView *Img;
  undefined1 local_200 [8];
  string _msg_3;
  undefined1 local_1d8 [3];
  bool IsTexView_1;
  Uint32 ArrInd_3;
  string msg_4;
  string msg_3;
  Uint32 ImmutableSamplerIdx;
  CachedResourceView *Tex;
  undefined1 local_168 [8];
  string _msg_2;
  undefined1 local_140 [3];
  bool IsTexView;
  Uint32 ArrInd_2;
  undefined1 local_120 [8];
  string _msg_1;
  undefined1 local_f8 [4];
  Uint32 ArrInd_1;
  undefined1 local_d8 [8];
  string _msg;
  Uint32 ArrInd;
  bool BindingsOK;
  string msg_2;
  string msg_1;
  PipelineResourceAttribsType *ResAttr;
  PipelineResourceDesc *ResDesc;
  undefined1 local_50 [8];
  string msg;
  ShaderResourceCacheGL *ResourceCache_local;
  Uint32 ResIndex_local;
  bool IsMultisample_local;
  RESOURCE_DIMENSION ResourceDim_local;
  GLResourceAttribs *GLAttribs_local;
  PipelineResourceSignatureGLImpl *this_local;
  
  msg.field_2._8_8_ = ResourceCache;
  if ((this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.NumResources <= ResIndex) {
    FormatString<char[26],char[31]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResIndex < m_Desc.NumResources",(char (*) [31])this);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
               ,0x221);
    std::__cxx11::string::~string((string *)local_50);
  }
  Desc = (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
         super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
         .m_Desc.Resources + ResIndex;
  Res = (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).m_pResourceAttribs
        + ResIndex;
  iVar6 = strcmp(Desc->Name,GLAttribs->Name);
  if (iVar6 != 0) {
    FormatString<char[28]>
              ((string *)((long)&msg_2.field_2 + 8),(char (*) [28])"Inconsistent resource names");
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
               ,0x224);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (Desc->ResourceType == SHADER_RESOURCE_TYPE_SAMPLER) {
    this_local._7_1_ = true;
  }
  else {
    if (Desc->ArraySize < GLAttribs->ArraySize) {
      FormatString<char[26],char[41]>
                ((string *)&ArrInd,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GLAttribs.ArraySize <= ResDesc.ArraySize",(char (*) [41])Desc);
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar9,"DvpValidateCommittedResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                 ,0x229);
      std::__cxx11::string::~string((string *)&ArrInd);
    }
    _msg.field_2._M_local_buf[0xf] = '\x01';
    BVar7 = PipelineResourceToBindingRange(Desc);
    switch(BVar7) {
    case BINDING_RANGE_UNIFORM_BUFFER:
      for (_msg.field_2._8_4_ = 0; (uint)_msg.field_2._8_4_ < GLAttribs->ArraySize;
          _msg.field_2._8_4_ = _msg.field_2._8_4_ + 1) {
        bVar5 = ShaderResourceCacheGL::IsUBBound
                          ((ShaderResourceCacheGL *)msg.field_2._8_8_,
                           Res->CacheOffset + _msg.field_2._8_4_);
        if (!bVar5) {
          GetShaderResourcePrintName<Diligent::ShaderResourcesGL::GLResourceAttribs>
                    ((String *)local_f8,GLAttribs,_msg.field_2._8_4_);
          FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                    ((string *)local_d8,(Diligent *)"No resource is bound to variable \'",
                     (char (*) [35])local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\' in shader \'",(char (*) [14])&ShaderName,(char **)"\' of PSO \'",
                     (char (*) [11])&PSOName,(char **)0x4588e8,in_stack_fffffffffffffcd8);
          std::__cxx11::string::~string((string *)local_f8);
          puVar3 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar10 = std::__cxx11::string::c_str();
            (*(code *)puVar3)(2,uVar10,0);
          }
          std::__cxx11::string::~string((string *)local_d8);
          _msg.field_2._M_local_buf[0xf] = '\0';
        }
      }
      break;
    case BINDING_RANGE_TEXTURE:
      for (_msg_2.field_2._12_4_ = 0; (uint)_msg_2.field_2._12_4_ < GLAttribs->ArraySize;
          _msg_2.field_2._12_4_ = _msg_2.field_2._12_4_ + 1) {
        local_291 = true;
        if (Desc->ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV) {
          local_291 = Desc->ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT;
        }
        _msg_2.field_2._M_local_buf[0xb] = local_291;
        bVar5 = ShaderResourceCacheGL::IsTextureBound
                          ((ShaderResourceCacheGL *)msg.field_2._8_8_,
                           Res->CacheOffset + _msg_2.field_2._12_4_,local_291);
        if (bVar5) {
          this_00 = ShaderResourceCacheGL::GetConstTexture
                              ((ShaderResourceCacheGL *)msg.field_2._8_8_,
                               Res->CacheOffset + _msg_2.field_2._12_4_);
          uVar4 = _msg_2.field_2._12_4_;
          if (this_00->pTexture == (TextureBaseGL *)0x0) {
            pcVar2 = GLAttribs->Name;
            UVar8 = GLAttribs->ArraySize;
            pIVar13 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::IBufferView>
                                (&this_00->pView);
            ValidateResourceViewDimension<Diligent::IBufferView>
                      (pcVar2,UVar8,uVar4,pIVar13,ResourceDim,IsMultisample);
          }
          else {
            pcVar2 = GLAttribs->Name;
            UVar8 = GLAttribs->ArraySize;
            pIVar12 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::ITextureView>
                                (&this_00->pView);
            ValidateResourceViewDimension<Diligent::ITextureView>
                      (pcVar2,UVar8,uVar4,pIVar12,ResourceDim,IsMultisample);
          }
          UVar8 = GetImmutableSamplerIdx(this,Res);
          if (UVar8 != 0xffffffff) {
            if ((this_00->field_2).pBuffer == (BufferGLImpl *)0x0) {
              FormatString<char[66]>
                        ((string *)((long)&msg_4.field_2 + 8),
                         (char (*) [66])
                         "Immutable sampler is not initialized in the cache - this is a bug");
              pCVar9 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar9,"DvpValidateCommittedResource",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                         ,0x25d);
              std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
            }
            pBVar1 = (this_00->field_2).pBuffer;
            pBVar11 = (BufferGLImpl *)
                      Diligent::RefCntAutoPtr::operator_cast_to_SamplerGLImpl_
                                ((RefCntAutoPtr *)
                                 ((this->
                                  super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>)
                                  .m_pImmutableSamplers + UVar8));
            if (pBVar1 != pBVar11) {
              FormatString<char[56]>
                        ((string *)local_1d8,
                         (char (*) [56])"Immutable sampler initialized in the cache is not valid");
              pCVar9 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar9,"DvpValidateCommittedResource",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                         ,0x25e);
              std::__cxx11::string::~string((string *)local_1d8);
            }
          }
        }
        else {
          GetShaderResourcePrintName<Diligent::ShaderResourcesGL::GLResourceAttribs>
                    ((String *)&Tex,GLAttribs,_msg_2.field_2._12_4_);
          FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                    ((string *)local_168,(Diligent *)"No resource is bound to variable \'",
                     (char (*) [35])&Tex,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\' in shader \'",(char (*) [14])&ShaderName,(char **)"\' of PSO \'",
                     (char (*) [11])&PSOName,(char **)0x4588e8,in_stack_fffffffffffffcd8);
          std::__cxx11::string::~string((string *)&Tex);
          puVar3 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar10 = std::__cxx11::string::c_str();
            (*(code *)puVar3)(2,uVar10,0);
          }
          std::__cxx11::string::~string((string *)local_168);
          _msg.field_2._M_local_buf[0xf] = '\0';
        }
      }
      break;
    case BINDING_RANGE_IMAGE:
      for (_msg_3.field_2._12_4_ = 0; (uint)_msg_3.field_2._12_4_ < GLAttribs->ArraySize;
          _msg_3.field_2._12_4_ = _msg_3.field_2._12_4_ + 1) {
        local_2e1 = true;
        if (Desc->ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV) {
          local_2e1 = Desc->ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV;
        }
        _msg_3.field_2._M_local_buf[0xb] = local_2e1;
        bVar5 = ShaderResourceCacheGL::IsImageBound
                          ((ShaderResourceCacheGL *)msg.field_2._8_8_,
                           Res->CacheOffset + _msg_3.field_2._12_4_,local_2e1);
        if (bVar5) {
          msg_5.field_2._8_8_ =
               (size_type)
               ShaderResourceCacheGL::GetConstImage
                         (msg.field_2._8_8_,Res->CacheOffset + _msg_3.field_2._12_4_);
          uVar4 = _msg_3.field_2._12_4_;
          if (((CachedResourceView *)msg_5.field_2._8_8_)->pTexture == (TextureBaseGL *)0x0) {
            pcVar2 = GLAttribs->Name;
            UVar8 = GLAttribs->ArraySize;
            pIVar13 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::IBufferView>
                                ((RefCntAutoPtr<Diligent::IDeviceObject> *)msg_5.field_2._8_8_);
            ValidateResourceViewDimension<Diligent::IBufferView>
                      (pcVar2,UVar8,uVar4,pIVar13,ResourceDim,IsMultisample);
          }
          else {
            pcVar2 = GLAttribs->Name;
            UVar8 = GLAttribs->ArraySize;
            pIVar12 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::ITextureView>
                                ((RefCntAutoPtr<Diligent::IDeviceObject> *)msg_5.field_2._8_8_);
            ValidateResourceViewDimension<Diligent::ITextureView>
                      (pcVar2,UVar8,uVar4,pIVar12,ResourceDim,IsMultisample);
          }
        }
        else {
          GetShaderResourcePrintName<Diligent::ShaderResourcesGL::GLResourceAttribs>
                    ((String *)&Img,GLAttribs,_msg_3.field_2._12_4_);
          FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                    ((string *)local_200,(Diligent *)"No resource is bound to variable \'",
                     (char (*) [35])&Img,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\' in shader \'",(char (*) [14])&ShaderName,(char **)"\' of PSO \'",
                     (char (*) [11])&PSOName,(char **)0x4588e8,in_stack_fffffffffffffcd8);
          std::__cxx11::string::~string((string *)&Img);
          puVar3 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar10 = std::__cxx11::string::c_str();
            (*(code *)puVar3)(2,uVar10,0);
          }
          std::__cxx11::string::~string((string *)local_200);
          _msg.field_2._M_local_buf[0xf] = '\0';
        }
      }
      break;
    case BINDING_RANGE_STORAGE_BUFFER:
      for (_msg_1.field_2._12_4_ = 0; (uint)_msg_1.field_2._12_4_ < GLAttribs->ArraySize;
          _msg_1.field_2._12_4_ = _msg_1.field_2._12_4_ + 1) {
        bVar5 = ShaderResourceCacheGL::IsSSBOBound
                          ((ShaderResourceCacheGL *)msg.field_2._8_8_,
                           Res->CacheOffset + _msg_1.field_2._12_4_);
        if (!bVar5) {
          GetShaderResourcePrintName<Diligent::ShaderResourcesGL::GLResourceAttribs>
                    ((String *)local_140,GLAttribs,_msg_1.field_2._12_4_);
          FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                    ((string *)local_120,(Diligent *)"No resource is bound to variable \'",
                     (char (*) [35])local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\' in shader \'",(char (*) [14])&ShaderName,(char **)"\' of PSO \'",
                     (char (*) [11])&PSOName,(char **)0x4588e8,in_stack_fffffffffffffcd8);
          std::__cxx11::string::~string((string *)local_140);
          puVar3 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar10 = std::__cxx11::string::c_str();
            (*(code *)puVar3)(2,uVar10,0);
          }
          std::__cxx11::string::~string((string *)local_120);
          _msg.field_2._M_local_buf[0xf] = '\0';
        }
      }
      break;
    default:
      FormatString<char[40]>
                ((string *)local_248,(char (*) [40])"Unsupported shader resource range type.");
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar9,"DvpValidateCommittedResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                 ,0x278);
      std::__cxx11::string::~string((string *)local_248);
    }
    this_local._7_1_ = (bool)(_msg.field_2._M_local_buf[0xf] & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool PipelineResourceSignatureGLImpl::DvpValidateCommittedResource(const ShaderResourcesGL::GLResourceAttribs& GLAttribs,
                                                                   RESOURCE_DIMENSION                          ResourceDim,
                                                                   bool                                        IsMultisample,
                                                                   Uint32                                      ResIndex,
                                                                   const ShaderResourceCacheGL&                ResourceCache,
                                                                   const char*                                 ShaderName,
                                                                   const char*                                 PSOName) const
{
    VERIFY_EXPR(ResIndex < m_Desc.NumResources);
    const auto& ResDesc = m_Desc.Resources[ResIndex];
    const auto& ResAttr = m_pResourceAttribs[ResIndex];
    VERIFY(strcmp(ResDesc.Name, GLAttribs.Name) == 0, "Inconsistent resource names");

    if (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)
        return true; // Skip separate samplers

    VERIFY_EXPR(GLAttribs.ArraySize <= ResDesc.ArraySize);

    bool BindingsOK = true;

    static_assert(BINDING_RANGE_COUNT == 4, "Please update the switch below to handle the new shader resource range");
    switch (PipelineResourceToBindingRange(ResDesc))
    {
        case BINDING_RANGE_UNIFORM_BUFFER:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                if (!ResourceCache.IsUBBound(ResAttr.CacheOffset + ArrInd))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                }
            }
            break;

        case BINDING_RANGE_STORAGE_BUFFER:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                if (!ResourceCache.IsSSBOBound(ResAttr.CacheOffset + ArrInd))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                }
            }
            break;

        case BINDING_RANGE_TEXTURE:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                const bool IsTexView = (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT);
                if (!ResourceCache.IsTextureBound(ResAttr.CacheOffset + ArrInd, IsTexView))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                    continue;
                }

                const auto& Tex = ResourceCache.GetConstTexture(ResAttr.CacheOffset + ArrInd);
                if (Tex.pTexture)
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Tex.pView.RawPtr<ITextureView>(), ResourceDim, IsMultisample);
                else
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Tex.pView.RawPtr<IBufferView>(), ResourceDim, IsMultisample);

                const auto ImmutableSamplerIdx = GetImmutableSamplerIdx(ResAttr);
                if (ImmutableSamplerIdx != InvalidImmutableSamplerIndex)
                {
                    VERIFY(Tex.pSampler != nullptr, "Immutable sampler is not initialized in the cache - this is a bug");
                    VERIFY(Tex.pSampler == m_pImmutableSamplers[ImmutableSamplerIdx], "Immutable sampler initialized in the cache is not valid");
                }
            }
            break;

        case BINDING_RANGE_IMAGE:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                const bool IsTexView = (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV);
                if (!ResourceCache.IsImageBound(ResAttr.CacheOffset + ArrInd, IsTexView))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                    continue;
                }

                const auto& Img = ResourceCache.GetConstImage(ResAttr.CacheOffset + ArrInd);
                if (Img.pTexture)
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Img.pView.RawPtr<ITextureView>(), ResourceDim, IsMultisample);
                else
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Img.pView.RawPtr<IBufferView>(), ResourceDim, IsMultisample);
            }
            break;

        default:
            UNEXPECTED("Unsupported shader resource range type.");
    }

    return BindingsOK;
}